

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O3

bool absl::lts_20250127::str_format_internal::FormatUntyped
               (FormatRawSinkImpl raw_sink,UntypedFormatSpecImpl format,
               Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  void *pvVar4;
  size_t sVar5;
  int *next_arg_00;
  char *pcVar6;
  undefined8 extraout_RDX;
  size_t extraout_RDX_00;
  byte *extraout_RDX_02;
  byte *pbVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  byte bVar11;
  byte *pbVar12;
  string_view v;
  string_view v_00;
  string_view v_01;
  string_view v_02;
  string_view conv_string;
  string_view conv_string_00;
  string_view conv_string_01;
  int next_arg;
  FormatSinkImpl sink;
  int local_47c;
  ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::DefaultConverter>
  local_478;
  UnboundConversion local_460;
  FormatSinkImpl local_450;
  byte *extraout_RDX_01;
  
  local_450.raw_.write_ = raw_sink.write_;
  local_450.raw_.sink_ = raw_sink.sink_;
  sVar5 = format.size_;
  pbVar12 = (byte *)format.data_;
  local_478.arg_context_.pack_.len_ = args.len_;
  local_478.arg_context_.pack_.ptr_ = args.ptr_;
  local_450.pos_ = local_450.buf_;
  local_450.size_ = 0;
  if (sVar5 == 0xffffffffffffffff) {
    local_478.converter_.sink_ = &local_450;
    pcVar10 = *(char **)(pbVar12 + 0x10);
    pcVar1 = *(char **)(pbVar12 + 0x18);
    if (pcVar10 != pcVar1) {
      pcVar2 = *(char **)(pbVar12 + 8);
      pcVar8 = (char *)0x0;
      pcVar6 = (char *)0xffffffffffffffff;
      pbVar7 = pbVar12;
      pcVar9 = pcVar2;
      do {
        pcVar9 = pcVar9 + (long)pcVar8;
        pcVar8 = pcVar2 + (*(long *)(pcVar10 + 8) - (long)pcVar9);
        if (*pcVar10 == '\x01') {
          conv_string_01._M_str = pcVar6;
          conv_string_01._M_len = (size_t)pbVar7;
          bVar3 = anon_unknown_3::
                  ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::DefaultConverter>
                  ::ConvertOne(&local_478,(UnboundConversion *)(pcVar10 + 0x10),conv_string_01);
          pbVar7 = extraout_RDX_01;
          if (!bVar3) goto LAB_002cc490;
        }
        else {
          v_01._M_str = pcVar9;
          v_01._M_len = (size_t)pcVar8;
          FormatSinkImpl::Append(&local_450,v_01);
          pbVar7 = extraout_RDX_02;
        }
        pcVar10 = pcVar10 + 0x20;
      } while (pcVar10 != pcVar1);
    }
    bVar11 = *pbVar12 ^ 1;
  }
  else {
    local_478.converter_.sink_ = &local_450;
    local_47c = 0;
    bVar11 = 1;
    if (sVar5 != 0) {
      pbVar7 = pbVar12 + sVar5;
      do {
        pvVar4 = memchr(pbVar12,0x25,(long)pbVar7 - (long)pbVar12);
        if (pvVar4 == (void *)0x0) {
          v_02._M_str = (char *)pbVar12;
          v_02._M_len = (long)pbVar7 - (long)pbVar12;
          FormatSinkImpl::Append(local_478.converter_.sink_,v_02);
          bVar11 = 1;
          goto LAB_002cc525;
        }
        v._M_len = (long)pvVar4 - (long)pbVar12;
        v._M_str = (char *)pbVar12;
        FormatSinkImpl::Append(local_478.converter_.sink_,v);
        pbVar12 = (byte *)((long)pvVar4 + 1);
        if (pbVar7 <= pbVar12) goto LAB_002cc490;
        if ((char)ConvTagHolder::value[*pbVar12].tag_ < '\0') {
          if (*pbVar12 == 0x25) {
            v_00._M_str = "%";
            v_00._M_len = 1;
            FormatSinkImpl::Append(local_478.converter_.sink_,v_00);
            goto LAB_002cc43d;
          }
          local_460.width.value_ = -1;
          local_460.precision.value_ = -1;
          local_460.flags = kBasic;
          local_460.length_mod = none;
          local_460.conv = v|s;
          next_arg_00 = &local_47c;
          pbVar12 = (byte *)ConsumeUnboundConversionNoInline
                                      ((char *)pbVar12,(char *)pbVar7,&local_460,next_arg_00);
          if ((pbVar12 == (byte *)0x0) ||
             (conv_string_00._M_str = (char *)next_arg_00, conv_string_00._M_len = extraout_RDX_00,
             bVar3 = anon_unknown_3::
                     ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::DefaultConverter>
                     ::ConvertOne(&local_478,&local_460,conv_string_00), !bVar3)) goto LAB_002cc490;
        }
        else {
          if (local_47c < 0) goto LAB_002cc490;
          local_460.width.value_ = -1;
          local_460.precision.value_ = -1;
          local_460.flags = kBasic;
          local_460.length_mod = none;
          conv_string._M_str._0_4_ = local_47c + 1;
          conv_string._M_len = extraout_RDX;
          conv_string._M_str._4_4_ = 0;
          local_47c = (int)conv_string._M_str;
          local_460.arg_position = (int)conv_string._M_str;
          local_460.conv = ConvTagHolder::value[*pbVar12].tag_;
          bVar3 = anon_unknown_3::
                  ConverterConsumer<absl::lts_20250127::str_format_internal::(anonymous_namespace)::DefaultConverter>
                  ::ConvertOne(&local_478,&local_460,conv_string);
          if (!bVar3) goto LAB_002cc490;
LAB_002cc43d:
          pbVar12 = (byte *)((long)pvVar4 + 2);
        }
      } while (pbVar12 != pbVar7);
      bVar11 = 1;
    }
  }
LAB_002cc525:
  FormatSinkImpl::~FormatSinkImpl(&local_450);
  return (bool)bVar11;
LAB_002cc490:
  bVar11 = 0;
  goto LAB_002cc525;
}

Assistant:

bool FormatUntyped(FormatRawSinkImpl raw_sink,
                   const UntypedFormatSpecImpl format,
                   absl::Span<const FormatArgImpl> args) {
  FormatSinkImpl sink(raw_sink);
  using Converter = DefaultConverter;
  return ConvertAll(format, args, Converter(&sink));
}